

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int ERKStepCreateAdjointStepper
              (void *arkode_mem,SUNAdjRhsFn adj_f,sunrealtype tf,N_Vector sf,
              SUNContext_conflict sunctx,SUNAdjointStepper *adj_stepper_ptr)

{
  int iVar1;
  void *arkode_mem_00;
  int line;
  char *pcVar2;
  SUNStepper_conflict adj_stepper;
  sunrealtype local_60;
  SUNStepper_conflict fwd_stepper;
  long nst;
  SUNContext_conflict local_48;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  
  pcVar2 = "ERKStepCreateAdjointStepper";
  local_60 = tf;
  iVar1 = erkStep_AccessARKODEStepMem(arkode_mem,"ERKStepCreateAdjointStepper",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    local_48 = sunctx;
    iVar1 = erkStepCompatibleWithAdjointSolver
                      (ark_mem,(ARKodeERKStepMem)pcVar2,0x6b5,"ERKStepCreateAdjointStepper",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                      );
    if (iVar1 == 0) {
      if (adj_f == (SUNAdjRhsFn)0x0) {
        pcVar2 = "adj_fe cannot be NULL.";
        iVar1 = -0x16;
        line = 0x6bf;
      }
      else {
        iVar1 = N_VGetVectorID(sf);
        if (iVar1 == 0xd) {
          nst = 0;
          iVar1 = ARKodeGetNumSteps(arkode_mem,&nst);
          if (iVar1 == 0) {
            arkode_mem_00 = ERKStepCreate(erkStep_fe_Adj,local_60,sf,ark_mem->sunctx);
            if (arkode_mem_00 == (void *)0x0) {
              pcVar2 = "ERKStepCreate returned NULL\n";
              iVar1 = -0x15;
              line = 0x6da;
            }
            else {
              *(SUNAdjRhsFn *)(*(long *)((long)arkode_mem_00 + 0x88) + 8) = adj_f;
              *(undefined4 *)((long)arkode_mem_00 + 0x410) = 1;
              iVar1 = ARKodeSetFixedStep(arkode_mem_00,-ark_mem->h);
              if (iVar1 == 0) {
                iVar1 = ERKStepSetTable(arkode_mem_00,step_mem->B);
                if (iVar1 == 0) {
                  iVar1 = ARKodeSetMaxNumSteps(arkode_mem_00,nst);
                  if (iVar1 == 0) {
                    iVar1 = ARKodeSetAdjointCheckpointScheme
                                      (arkode_mem_00,ark_mem->checkpoint_scheme);
                    if (iVar1 == 0) {
                      iVar1 = ARKodeCreateSUNStepper(arkode_mem,&fwd_stepper);
                      if (iVar1 == 0) {
                        iVar1 = SUNStepper_SetReInitFn(fwd_stepper,erkStep_SUNStepperReInit);
                        if (iVar1 == 0) {
                          iVar1 = ARKodeCreateSUNStepper(arkode_mem_00,&adj_stepper);
                          if (iVar1 == 0) {
                            iVar1 = SUNStepper_SetReInitFn(adj_stepper,erkStep_SUNStepperReInit);
                            if (iVar1 == 0) {
                              iVar1 = SUNStepper_SetDestroyFn(adj_stepper,arkSUNStepperSelfDestruct)
                              ;
                              if (iVar1 == 0) {
                                iVar1 = SUNAdjointStepper_Create
                                                  (local_60,fwd_stepper,1,adj_stepper,1,nst + -1,sf,
                                                   ark_mem->checkpoint_scheme,local_48,
                                                   adj_stepper_ptr);
                                if (iVar1 == 0) {
                                  iVar1 = SUNAdjointStepper_SetUserData
                                                    (*adj_stepper_ptr,ark_mem->user_data);
                                  if (iVar1 == 0) {
                                    iVar1 = ARKodeSetUserData(arkode_mem_00,*adj_stepper_ptr);
                                    if (iVar1 == 0) {
                                      return 0;
                                    }
                                    pcVar2 = "ARKodeSetUserData failed";
                                    line = 0x750;
                                  }
                                  else {
                                    pcVar2 = "SUNAdjointStepper_SetUserData failed";
                                    iVar1 = -0x37;
                                    line = 0x746;
                                  }
                                }
                                else {
                                  pcVar2 = "SUNAdjointStepper_Create failed";
                                  iVar1 = -0x37;
                                  line = 0x73d;
                                }
                              }
                              else {
                                pcVar2 = "SUNStepper_SetDestroyFn failed";
                                iVar1 = -0x33;
                                line = 0x731;
                              }
                            }
                            else {
                              pcVar2 = "SUNStepper_SetReInitFn failed";
                              iVar1 = -0x33;
                              line = 0x726;
                            }
                          }
                          else {
                            pcVar2 = "ARKodeCreateSUNStepper failed";
                            line = 0x71d;
                          }
                        }
                        else {
                          pcVar2 = "SUNStepper_SetReInitFn failed";
                          iVar1 = -0x33;
                          line = 0x714;
                        }
                      }
                      else {
                        pcVar2 = "ARKodeCreateSUNStepper failed";
                        line = 0x70b;
                      }
                    }
                    else {
                      pcVar2 = "ARKodeSetAdjointCheckpointScheme failed";
                      line = 0x700;
                    }
                  }
                  else {
                    pcVar2 = "ARKodeSetMaxNumSteps failed";
                    line = 0x6f7;
                  }
                }
                else {
                  pcVar2 = "ERKStepSetTables failed";
                  line = 0x6ef;
                }
              }
              else {
                pcVar2 = "ARKodeSetFixedStep failed";
                line = 0x6e7;
              }
            }
          }
          else {
            pcVar2 = "ARKodeGetNumSteps failed";
            line = 0x6d2;
          }
        }
        else {
          pcVar2 = "Incompatible vector type provided for adjoint calculation";
          iVar1 = -0x16;
          line = 0x6c6;
        }
      }
    }
    else {
      pcVar2 = "ark_mem provided is not compatible with adjoint calculation";
      iVar1 = -0x16;
      line = 0x6b8;
    }
  }
  else {
    pcVar2 = "The ERKStep memory pointer is NULL";
    ark_mem = (ARKodeMem)0x0;
    iVar1 = -0x16;
    line = 0x6b0;
  }
  arkProcessError(ark_mem,iVar1,line,"ERKStepCreateAdjointStepper",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                  ,pcVar2);
  return iVar1;
}

Assistant:

int ERKStepCreateAdjointStepper(void* arkode_mem, SUNAdjRhsFn adj_f,
                                sunrealtype tf, N_Vector sf, SUNContext sunctx,
                                SUNAdjointStepper* adj_stepper_ptr)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval = erkStep_AccessARKODEStepMem(arkode_mem,
                                           "ERKStepCreateAdjointStepper",
                                           &ark_mem, &step_mem);
  if (retval)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The ERKStep memory pointer is NULL");
    return ARK_ILL_INPUT;
  }

  if (erkStepCompatibleWithAdjointSolver(ark_mem, step_mem, __LINE__, __func__,
                                         __FILE__))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "ark_mem provided is not compatible with adjoint calculation");
    return ARK_ILL_INPUT;
  }

  if (!adj_f)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "adj_fe cannot be NULL.");
    return ARK_ILL_INPUT;
  }

  if (N_VGetVectorID(sf) != SUNDIALS_NVEC_MANYVECTOR)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Incompatible vector type provided for adjoint calculation");
    return ARK_ILL_INPUT;
  }

  /**
    Create and configure the ERKStep stepper for the adjoint system
  */
  long nst = 0;
  retval   = ARKodeGetNumSteps(arkode_mem, &nst);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeGetNumSteps failed");
    return retval;
  }

  void* arkode_mem_adj = ERKStepCreate(erkStep_fe_Adj, tf, sf, ark_mem->sunctx);
  if (!arkode_mem_adj)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ERKStepCreate returned NULL\n");
    return ARK_MEM_NULL;
  }
  ARKodeMem ark_mem_adj         = (ARKodeMem)arkode_mem_adj;
  ARKodeERKStepMem step_mem_adj = (ARKodeERKStepMem)ark_mem_adj->step_mem;

  step_mem_adj->adj_f     = adj_f;
  ark_mem_adj->do_adjoint = SUNTRUE;

  retval = ARKodeSetFixedStep(arkode_mem_adj, -ark_mem->h);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetFixedStep failed");
    return retval;
  }

  retval = ERKStepSetTable(arkode_mem_adj, step_mem->B);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ERKStepSetTables failed");
    return retval;
  }

  retval = ARKodeSetMaxNumSteps(arkode_mem_adj, nst);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetMaxNumSteps failed");
    return retval;
  }

  retval = ARKodeSetAdjointCheckpointScheme(arkode_mem_adj,
                                            ark_mem->checkpoint_scheme);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetAdjointCheckpointScheme failed");
    return retval;
  }

  SUNErrCode errcode = SUN_SUCCESS;

  SUNStepper fwd_stepper;
  retval = ARKodeCreateSUNStepper(arkode_mem, &fwd_stepper);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeCreateSUNStepper failed");
    return retval;
  }

  errcode = SUNStepper_SetReInitFn(fwd_stepper, erkStep_SUNStepperReInit);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetReInitFn failed");
    return retval;
  }

  SUNStepper adj_stepper;
  retval = ARKodeCreateSUNStepper(arkode_mem_adj, &adj_stepper);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeCreateSUNStepper failed");
    return retval;
  }

  errcode = SUNStepper_SetReInitFn(adj_stepper, erkStep_SUNStepperReInit);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetReInitFn failed");
    return retval;
  }

  /* Setting this ensures that the ARKodeMem underneath the adj_stepper
     is destroyed with the SUNStepper_Destroy call. */
  errcode = SUNStepper_SetDestroyFn(adj_stepper, arkSUNStepperSelfDestruct);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetDestroyFn failed");
    return retval;
  }

  /* SUNAdjointStepper will own the SUNSteppers and destroy them */
  errcode = SUNAdjointStepper_Create(fwd_stepper, SUNTRUE, adj_stepper, SUNTRUE,
                                     nst - 1, tf, sf, ark_mem->checkpoint_scheme,
                                     sunctx, adj_stepper_ptr);
  if (errcode)
  {
    retval = ARK_SUNADJSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNAdjointStepper_Create failed");
    return retval;
  }

  errcode = SUNAdjointStepper_SetUserData(*adj_stepper_ptr, ark_mem->user_data);
  if (errcode)
  {
    retval = ARK_SUNADJSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNAdjointStepper_SetUserData failed");
    return retval;
  }

  /* We need access to the adjoint solver to access the parameter Jacobian inside of ERKStep's
     backwards integration of the the adjoint problem. */
  retval = ARKodeSetUserData(arkode_mem_adj, *adj_stepper_ptr);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetUserData failed");
    return retval;
  }

  return ARK_SUCCESS;
}